

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::initFrameBuffer(SRGBTestCase *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  deBool dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  invalid_argument *this_00;
  ObjectWrapper *this_01;
  size_type sVar6;
  reference pvVar7;
  TestError *this_02;
  ulong local_70;
  size_t renderBufferIdx_1;
  undefined1 local_60 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> renderBufferTargets;
  ulong local_40;
  size_t renderBufferIdx;
  int local_30;
  GLuint renderBuffer;
  int outputIdx;
  int local_20;
  int local_1c;
  int height;
  int width;
  Functions *gl;
  SRGBTestCase *this_local;
  
  gl = (Functions *)this;
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  _height = CONCAT44(extraout_var,iVar2);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[4])();
  local_1c = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_00,iVar2));
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[4])();
  local_20 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_01,iVar2));
  if (this->m_resultOutputTotal == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"SRGBTestExecutor must have at least 1 rendered result");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar1 = *(code **)(_height + 0x78);
  this_01 = &de::details::
             UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             ::operator*(&(this->m_framebuffer).
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        )->super_ObjectWrapper;
  dVar3 = glu::ObjectWrapper::operator*(this_01);
  (*pcVar1)(0x8d40,dVar3);
  for (local_30 = 0; local_30 < this->m_resultOutputTotal; local_30 = local_30 + 1) {
    renderBufferIdx._4_4_ = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_renderBufferList,(value_type_conflict4 *)((long)&renderBufferIdx + 4));
  }
  for (local_40 = 0;
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&this->m_renderBufferList), local_40 < sVar6; local_40 = local_40 + 1) {
    pcVar1 = *(code **)(_height + 0x6e8);
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_renderBufferList,local_40);
    (*pcVar1)(1,pvVar7);
    pcVar1 = *(code **)(_height + 0xa0);
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_renderBufferList,local_40);
    (*pcVar1)(0x8d41,*pvVar7);
    pcVar1 = *(code **)(_height + 0x1238);
    renderBufferTargets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)&this->m_resultTextureFormat;
    dVar3 = glu::getInternalFormat
                      ((TextureFormat)
                       renderBufferTargets.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    (*pcVar1)(0x8d41,dVar3,local_1c,local_20);
    pcVar1 = *(code **)(_height + 0x688);
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_renderBufferList,local_40);
    (*pcVar1)(0x8d40,(int)local_40 + 0x8ce0,0x8d41,*pvVar7);
    dVar3 = (**(code **)(_height + 0x800))();
    glu::checkError(dVar3,"Create and setup renderbuffer object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                    ,0x564);
  }
  while ((dVar4 = ::deGetFalse(), dVar4 == 0 &&
         (iVar2 = (**(code **)(_height + 0x170))(0x8d40), iVar2 == 0x8cd5))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&this->m_renderBufferList);
      std::allocator<unsigned_int>::allocator
                ((allocator<unsigned_int> *)((long)&renderBufferIdx_1 + 7));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,sVar6,
                 (allocator<unsigned_int> *)((long)&renderBufferIdx_1 + 7));
      std::allocator<unsigned_int>::~allocator
                ((allocator<unsigned_int> *)((long)&renderBufferIdx_1 + 7));
      for (local_70 = 0;
          sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            (&this->m_renderBufferList), local_70 < sVar6; local_70 = local_70 + 1)
      {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,local_70
                           );
        *pvVar7 = (int)local_70 + 0x8ce0;
      }
      pcVar1 = *(code **)(_height + 0x560);
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,0);
      (*pcVar1)(sVar6 & 0xffffffff,pvVar7);
      dVar3 = (**(code **)(_height + 0x800))();
      glu::checkError(dVar3,"glDrawBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                      ,0x56e);
      (**(code **)(_height + 0x78))(0x8d40,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
      return;
    }
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,(char *)0x0,
             "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
             ,0x566);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void SRGBTestCase::initFrameBuffer (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	int						width	= m_context.getRenderContext().getRenderTarget().getWidth();
	int						height	= m_context.getRenderContext().getRenderTarget().getHeight();

	if (m_resultOutputTotal == 0)
	{
		throw std::invalid_argument("SRGBTestExecutor must have at least 1 rendered result");
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, **m_framebuffer);

	DE_ASSERT(m_renderBufferList.empty());
	for (int outputIdx = 0; outputIdx < m_resultOutputTotal; outputIdx++)
	{
		glw::GLuint renderBuffer = -1;
		m_renderBufferList.push_back(renderBuffer);
	}

	for (std::size_t renderBufferIdx = 0; renderBufferIdx < m_renderBufferList.size(); renderBufferIdx++)
	{
		gl.genRenderbuffers(1, &m_renderBufferList[renderBufferIdx]);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_renderBufferList[renderBufferIdx]);
		gl.renderbufferStorage(GL_RENDERBUFFER, glu::getInternalFormat(m_resultTextureFormat), width, height);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + (glw::GLenum)renderBufferIdx, GL_RENDERBUFFER, m_renderBufferList[renderBufferIdx]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Create and setup renderbuffer object");
	}
	TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	std::vector<glw::GLenum> renderBufferTargets(m_renderBufferList.size());
	for (std::size_t renderBufferIdx = 0; renderBufferIdx < m_renderBufferList.size(); renderBufferIdx++)
	{
		renderBufferTargets[renderBufferIdx] = GL_COLOR_ATTACHMENT0 + (glw::GLenum)renderBufferIdx;
	}
	gl.drawBuffers((glw::GLsizei)renderBufferTargets.size(), &renderBufferTargets[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffer()");

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
}